

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qetag.c
# Opt level: O1

Qiniu_Error Qiniu_Qetag_New(_Qiniu_Qetag_Context **ctx,uint concurrency)

{
  uint uVar1;
  _Qiniu_Qetag_Context *ctx_00;
  uint uVar2;
  char *pcVar3;
  Qiniu_Error QVar4;
  
  uVar1 = 0x10;
  if (concurrency < 0x10) {
    uVar1 = concurrency;
  }
  uVar2 = 1;
  if (concurrency != 0) {
    uVar2 = uVar1;
  }
  ctx_00 = (_Qiniu_Qetag_Context *)calloc(1,(ulong)(uVar2 - 1) * 0x10 + 0x30);
  if (ctx_00 == (_Qiniu_Qetag_Context *)0x0) {
    pcVar3 = "not enough memory";
    uVar1 = 9999;
  }
  else {
    ctx_00->blkElementCount = (unsigned_short)uVar2;
    QVar4 = Qiniu_Qetag_Reset(ctx_00);
    pcVar3 = QVar4.message;
    uVar1 = QVar4.code;
    if (uVar1 == 200) {
      *ctx = ctx_00;
      pcVar3 = "ok";
      uVar1 = 200;
    }
    else {
      free(ctx_00);
    }
  }
  QVar4._4_4_ = 0;
  QVar4.code = uVar1;
  QVar4.message = pcVar3;
  return QVar4;
}

Assistant:

Qiniu_Error Qiniu_Qetag_New(struct _Qiniu_Qetag_Context ** ctx, unsigned int concurrency)
{
    Qiniu_Error err;
    Qiniu_Qetag_Context * newCtx = NULL;

    // 分配主结构体
    if (concurrency < 1) {
        concurrency = 1;
    } else if (concurrency > BLOCK_ELEMENT_MAX_COUNT) {
        concurrency = BLOCK_ELEMENT_MAX_COUNT;
    } // if

    newCtx = calloc(1, sizeof(*newCtx) + sizeof(newCtx->blkArray[0]) * (concurrency - 1));
    if (newCtx == NULL) {
        err.code = 9999;
        err.message = "not enough memory";
        return err;
    }
    newCtx->blkElementCount = concurrency;

    err = Qiniu_Qetag_Reset(newCtx);
    if (err.code != 200) {
        Qiniu_Qetag_Destroy(newCtx);
        return err;
    }

    *ctx = newCtx;
    err.code = 200;
    err.message = "ok";
    return err;
}